

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

set_iterator set_iterator_begin(set s)

{
  size_t sVar1;
  set in_RDI;
  set_iterator it;
  set_iterator local_8;
  
  if ((((in_RDI == (set)0x0) || (in_RDI->buckets == (bucket)0x0)) ||
      (sVar1 = set_size(in_RDI), sVar1 == 0)) ||
     (local_8 = (set_iterator)malloc(0x18), local_8 == (set_iterator)0x0)) {
    local_8 = (set_iterator)0x0;
  }
  else {
    local_8->s = in_RDI;
    local_8->current_bucket = 0;
    local_8->current_pair = 0;
    set_iterator_next(local_8);
  }
  return local_8;
}

Assistant:

set_iterator set_iterator_begin(set s)
{
	if (s != NULL && s->buckets != NULL && set_size(s) > 0)
	{
		set_iterator it = malloc(sizeof(struct set_iterator_type));

		if (it != NULL)
		{
			it->s = s;
			it->current_bucket = 0;
			it->current_pair = 0;

			set_iterator_next(it);

			return it;
		}
	}

	return NULL;
}